

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode trynextip(connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  CURLcode CVar1;
  Curl_addrinfo *pCVar2;
  int iVar3;
  
  sock = conn->tempsock[(uint)tempindex];
  conn->tempsock[(uint)tempindex] = -1;
  CVar1 = CURLE_COULDNT_CONNECT;
  if (sockindex == 0) {
    pCVar2 = conn->tempaddr[(uint)tempindex];
    if (pCVar2 == (Curl_addrinfo *)0x0) {
      pCVar2 = conn->tempaddr[0];
      if (pCVar2 == (Curl_addrinfo *)0x0) goto LAB_00412a75;
      iVar3 = (uint)(pCVar2->ai_family == 2) * 8 + 2;
    }
    else {
      iVar3 = pCVar2->ai_family;
    }
    pCVar2 = pCVar2->ai_next;
    if (pCVar2 != (Curl_addrinfo *)0x0) {
      do {
        if (conn->tempaddr[tempindex ^ 1] != (Curl_addrinfo *)0x0) {
          while (pCVar2->ai_family != iVar3) {
            pCVar2 = pCVar2->ai_next;
            if (pCVar2 == (Curl_addrinfo *)0x0) goto LAB_00412a6f;
          }
        }
        CVar1 = singleipconnect(conn,pCVar2,conn->tempsock + (uint)tempindex);
        if (CVar1 != CURLE_COULDNT_CONNECT) {
          conn->tempaddr[(uint)tempindex] = pCVar2;
          goto LAB_00412a75;
        }
        pCVar2 = pCVar2->ai_next;
      } while (pCVar2 != (Curl_addrinfo *)0x0);
LAB_00412a6f:
      CVar1 = CURLE_COULDNT_CONNECT;
    }
  }
LAB_00412a75:
  if (sock != -1) {
    Curl_closesocket(conn,sock);
  }
  return CVar1;
}

Assistant:

static CURLcode trynextip(struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  const int other = tempindex ^ 1;
  CURLcode result = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    Curl_addrinfo *ai = NULL;
    int family = AF_UNSPEC;

    if(conn->tempaddr[tempindex]) {
      /* find next address in the same protocol family */
      family = conn->tempaddr[tempindex]->ai_family;
      ai = conn->tempaddr[tempindex]->ai_next;
    }
#ifdef ENABLE_IPV6
    else if(conn->tempaddr[0]) {
      /* happy eyeballs - try the other protocol family */
      int firstfamily = conn->tempaddr[0]->ai_family;
      family = (firstfamily == AF_INET) ? AF_INET6 : AF_INET;
      ai = conn->tempaddr[0]->ai_next;
    }
#endif

    while(ai) {
      if(conn->tempaddr[other]) {
        /* we can safely skip addresses of the other protocol family */
        while(ai && ai->ai_family != family)
          ai = ai->ai_next;
      }

      if(ai) {
        result = singleipconnect(conn, ai, &conn->tempsock[tempindex]);
        if(result == CURLE_COULDNT_CONNECT) {
          ai = ai->ai_next;
          continue;
        }

        conn->tempaddr[tempindex] = ai;
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(conn, fd_to_close);

  return result;
}